

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O3

void Rwr_ManPrintStatsFile(Rwr_Man_t *p)

{
  FILE *__stream;
  
  __stream = fopen("stats.txt","a+");
  fprintf(__stream,"%d ",(ulong)(uint)p->nCutsGood);
  fprintf(__stream,"%d ",(ulong)(uint)p->nSubgraphs);
  fprintf(__stream,"%d ",(ulong)(uint)p->nNodesRewritten);
  fprintf(__stream,"%d",(ulong)(uint)p->nNodesGained);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Rwr_ManPrintStatsFile( Rwr_Man_t * p )
{
    FILE * pTable;
    pTable = fopen( "stats.txt", "a+" );
    fprintf( pTable, "%d ", p->nCutsGood );
    fprintf( pTable, "%d ", p->nSubgraphs );
    fprintf( pTable, "%d ", p->nNodesRewritten );
    fprintf( pTable, "%d", p->nNodesGained );
    fprintf( pTable, "\n" );
    fclose( pTable );
}